

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_disk_directory_traversals.c
# Opt level: O0

void test_callbacks(void)

{
  wchar_t wVar1;
  int iVar2;
  mode_t mVar3;
  char *pcVar4;
  la_int64_t lVar5;
  int iVar6;
  int local_3c;
  la_int64_t lStack_38;
  int file_count;
  int64_t offset;
  size_t size;
  void *p;
  archive_entry *ae;
  archive *m;
  archive *a;
  
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'Ծ',"cb",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                      ,L'Կ',"cb/f1",L'Ƥ',L'\xffffffff',"0123456789");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                      ,L'Հ',"cb/f2",L'Ƥ',L'\xffffffff',"hello world");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                      ,L'Ձ',"cb/fe",L'Ƥ',L'\xffffffff',(void *)0x0);
  assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                   ,L'Ղ',"cb/f1",0xd8748,0,0xd8748,0);
  assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                   ,L'Ճ',"cb/f2",0xd8753,0,0xd8753,0);
  assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                   ,L'Մ',"cb/fe",0xd8753,0,0xd8753,0);
  assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                   ,L'Յ',"cb",0xd875e,0,0xd875e,0);
  p = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                   ,L'Շ',(uint)((archive_entry *)p != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  m = archive_read_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                   ,L'Ո',(uint)(m != (archive *)0x0),"(a = archive_read_disk_new()) != NULL",
                   (void *)0x0);
  if (m == (archive *)0x0) {
    archive_entry_free((archive_entry *)p);
  }
  else {
    ae = (archive_entry *)archive_match_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'Ս',(uint)(ae != (archive_entry *)0x0),"(m = archive_match_new()) != NULL",
                     (void *)0x0);
    if (ae == (archive_entry *)0x0) {
      archive_entry_free((archive_entry *)p);
      archive_read_free(m);
      archive_match_free((archive *)ae);
    }
    else {
      local_3c = 3;
      wVar1 = archive_match_exclude_pattern((archive *)ae,"cb/f2");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'՚',0,"ARCHIVE_OK",(long)wVar1,
                          "archive_match_exclude_pattern(m, \"cb/f2\")",ae);
      wVar1 = archive_read_disk_set_matching
                        (m,(archive *)ae,(_func_void_archive_ptr_void_ptr_archive_entry_ptr *)0x0,
                         (void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'՜',0,"ARCHIVE_OK",(long)wVar1,
                          "archive_read_disk_set_matching(a, m, NULL, NULL)",m);
      failure("Directory traversals should work as well");
      wVar1 = archive_read_disk_open(m,"cb");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'՞',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_open(a, \"cb\")",m);
      while (iVar6 = local_3c + -1, local_3c != 0) {
        archive_entry_clear((archive_entry *)p);
        iVar2 = archive_read_next_header2(m,(archive_entry *)p);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'ա',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header2(a, ae)",m);
        failure("File \'cb/f2\' should be exclueded");
        pcVar4 = archive_entry_pathname((archive_entry *)p);
        iVar2 = strcmp(pcVar4,"cb/f2");
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                         ,L'գ',(uint)(iVar2 != 0),
                         "strcmp(archive_entry_pathname(ae), \"cb/f2\") != 0",(void *)0x0);
        pcVar4 = archive_entry_pathname((archive_entry *)p);
        iVar2 = strcmp(pcVar4,"cb");
        if (iVar2 == 0) {
          mVar3 = archive_entry_filetype((archive_entry *)p);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ե',(ulong)mVar3,"archive_entry_filetype(ae)",0x4000,"AE_IFDIR",
                              (void *)0x0);
        }
        else {
          pcVar4 = archive_entry_pathname((archive_entry *)p);
          iVar2 = strcmp(pcVar4,"cb/f1");
          if (iVar2 == 0) {
            mVar3 = archive_entry_filetype((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'է',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG",
                                (void *)0x0);
            lVar5 = archive_entry_size((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ը',lVar5,"archive_entry_size(ae)",10,"10",(void *)0x0);
            iVar2 = archive_read_data_block
                              (m,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffc8);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ժ',0,"ARCHIVE_OK",(long)iVar2,
                                "archive_read_data_block(a, &p, &size, &offset)",m);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ի',(long)(int)offset,"(int)size",10,"10",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'լ',(long)(int)lStack_38,"(int)offset",0,"0",(void *)0x0);
            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'խ',(void *)size,"p","0123456789","\"0123456789\"",10,"10",
                                (void *)0x0);
            iVar2 = archive_read_data_block
                              (m,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffc8);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'կ',1,"ARCHIVE_EOF",(long)iVar2,
                                "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'հ',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ձ',(long)(int)lStack_38,"(int)offset",10,"10",(void *)0x0);
          }
          else {
            pcVar4 = archive_entry_pathname((archive_entry *)p);
            iVar2 = strcmp(pcVar4,"cb/fe");
            if (iVar2 == 0) {
              mVar3 = archive_entry_filetype((archive_entry *)p);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ճ',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG"
                                  ,(void *)0x0);
              lVar5 = archive_entry_size((archive_entry *)p);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'մ',lVar5,"archive_entry_size(ae)",0,"0",(void *)0x0);
            }
          }
        }
        wVar1 = archive_read_disk_can_descend(m);
        local_3c = iVar6;
        if (wVar1 != L'\0') {
          wVar1 = archive_read_disk_descend(m);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'չ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_descend(a)",m);
        }
      }
      failure("There should be no entry");
      iVar6 = archive_read_next_header2(m,(archive_entry *)p);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'վ',1,"ARCHIVE_EOF",(long)iVar6,"archive_read_next_header2(a, ae)",m);
      iVar6 = archive_read_close(m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'ց',0,"ARCHIVE_OK",(long)iVar6,"archive_read_close(a)",(void *)0x0);
      wVar1 = archive_read_disk_set_matching
                        (m,(archive *)0x0,(_func_void_archive_ptr_void_ptr_archive_entry_ptr *)0x0,
                         (void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'օ',0,"ARCHIVE_OK",(long)wVar1,
                          "archive_read_disk_set_matching(a, NULL, NULL, NULL)",m);
      assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'֊',"cb/f1",0xd8748,0,0xd8748,0);
      assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'֋',"cb/f2",0xd8753,0,0xd8753,0);
      assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'֌',"cb/fe",0xd8753,0,0xd8753,0);
      assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'֍',"cb",0xd875e,0,0xd875e,0);
      local_3c = 3;
      wVar1 = archive_read_disk_set_metadata_filter_callback(m,metadata_filter,(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'֑',0,"ARCHIVE_OK",(long)wVar1,
                          "archive_read_disk_set_metadata_filter_callback(a, metadata_filter, NULL)"
                          ,m);
      failure("Directory traversals should work as well");
      wVar1 = archive_read_disk_open(m,"cb");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'֓',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_open(a, \"cb\")",m);
      while (iVar6 = local_3c + -1, local_3c != 0) {
        archive_entry_clear((archive_entry *)p);
        iVar2 = archive_read_next_header2(m,(archive_entry *)p);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'֗',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header2(a, ae)",m);
        failure("File \'cb/f1\' should be excluded");
        pcVar4 = archive_entry_pathname((archive_entry *)p);
        iVar2 = strcmp(pcVar4,"cb/f1");
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                         ,L'֙',(uint)(iVar2 != 0),
                         "strcmp(archive_entry_pathname(ae), \"cb/f1\") != 0",(void *)0x0);
        pcVar4 = archive_entry_pathname((archive_entry *)p);
        iVar2 = strcmp(pcVar4,"cb");
        local_3c = iVar6;
        if (iVar2 == 0) {
          mVar3 = archive_entry_filetype((archive_entry *)p);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'֛',(ulong)mVar3,"archive_entry_filetype(ae)",0x4000,"AE_IFDIR",
                              (void *)0x0);
        }
        else {
          pcVar4 = archive_entry_pathname((archive_entry *)p);
          iVar6 = strcmp(pcVar4,"cb/f2");
          if (iVar6 == 0) {
            mVar3 = archive_entry_filetype((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'֝',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG",
                                (void *)0x0);
            lVar5 = archive_entry_size((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'֞',lVar5,"archive_entry_size(ae)",0xb,"11",(void *)0x0);
            iVar6 = archive_read_data_block
                              (m,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffc8);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'֠',0,"ARCHIVE_OK",(long)iVar6,
                                "archive_read_data_block(a, &p, &size, &offset)",m);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'֡',(long)(int)offset,"(int)size",0xb,"11",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'֢',(long)(int)lStack_38,"(int)offset",0,"0",(void *)0x0);
            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'֣',(void *)size,"p","hello world","\"hello world\"",0xb,"11",
                                (void *)0x0);
            iVar6 = archive_read_data_block
                              (m,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffc8);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'֥',1,"ARCHIVE_EOF",(long)iVar6,
                                "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'֦',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'֧',(long)(int)lStack_38,"(int)offset",0xb,"11",(void *)0x0);
          }
          else {
            pcVar4 = archive_entry_pathname((archive_entry *)p);
            iVar6 = strcmp(pcVar4,"cb/fe");
            if (iVar6 == 0) {
              mVar3 = archive_entry_filetype((archive_entry *)p);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'֩',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG"
                                  ,(void *)0x0);
              lVar5 = archive_entry_size((archive_entry *)p);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'֪',lVar5,"archive_entry_size(ae)",0,"0",(void *)0x0);
            }
          }
        }
      }
      failure("There should be no entry");
      iVar6 = archive_read_next_header2(m,(archive_entry *)p);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'֯',1,"ARCHIVE_EOF",(long)iVar6,"archive_read_next_header2(a, ae)",m);
      iVar6 = archive_read_free(m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'ֲ',0,"ARCHIVE_OK",(long)iVar6,"archive_read_free(a)",(void *)0x0);
      wVar1 = archive_match_free((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'ֳ',0,"ARCHIVE_OK",(long)wVar1,"archive_match_free(m)",(void *)0x0);
      archive_entry_free((archive_entry *)p);
    }
  }
  return;
}

Assistant:

static void
test_callbacks(void)
{
	struct archive *a;
	struct archive *m;
	struct archive_entry *ae;
	const void *p;
	size_t size;
	int64_t offset;
	int file_count;

	assertMakeDir("cb", 0755);
	assertMakeFile("cb/f1", 0644, "0123456789");
	assertMakeFile("cb/f2", 0644, "hello world");
	assertMakeFile("cb/fe", 0644, NULL);
	assertUtimes("cb/f1", 886600, 0, 886600, 0);
	assertUtimes("cb/f2", 886611, 0, 886611, 0);
	assertUtimes("cb/fe", 886611, 0, 886611, 0);
	assertUtimes("cb", 886622, 0, 886622, 0);

	assert((ae = archive_entry_new()) != NULL);
	assert((a = archive_read_disk_new()) != NULL);
	if (a == NULL) {
		archive_entry_free(ae);
		return;
	}
	assert((m = archive_match_new()) != NULL);
	if (m == NULL) {
		archive_entry_free(ae);
		archive_read_free(a);
		archive_match_free(m);
		return;
	}

	/*
	 * Test1: Traversals with a name filter.
	 */
	file_count = 3;
	assertEqualIntA(m, ARCHIVE_OK,
	    archive_match_exclude_pattern(m, "cb/f2"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_disk_set_matching(a, m, NULL, NULL));
	failure("Directory traversals should work as well");
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "cb"));
	while (file_count--) {
		archive_entry_clear(ae);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
		failure("File 'cb/f2' should be exclueded");
		assert(strcmp(archive_entry_pathname(ae), "cb/f2") != 0);
		if (strcmp(archive_entry_pathname(ae), "cb") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
		} else if (strcmp(archive_entry_pathname(ae), "cb/f1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
		} else if (strcmp(archive_entry_pathname(ae), "cb/fe") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 0);
		}
		if (archive_read_disk_can_descend(a)) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* There is no entry. */
	failure("There should be no entry");
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));

	/* Reset name filter */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_disk_set_matching(a, NULL, NULL, NULL));

	/*
	 * Test2: Traversals with a metadata filter.
	 */
	assertUtimes("cb/f1", 886600, 0, 886600, 0);
	assertUtimes("cb/f2", 886611, 0, 886611, 0);
	assertUtimes("cb/fe", 886611, 0, 886611, 0);
	assertUtimes("cb", 886622, 0, 886622, 0);
	file_count = 3;
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_disk_set_metadata_filter_callback(a, metadata_filter,
		    NULL));
	failure("Directory traversals should work as well");
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "cb"));

	while (file_count--) {
		archive_entry_clear(ae);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
		failure("File 'cb/f1' should be excluded");
		assert(strcmp(archive_entry_pathname(ae), "cb/f1") != 0);
		if (strcmp(archive_entry_pathname(ae), "cb") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
		} else if (strcmp(archive_entry_pathname(ae), "cb/f2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 11);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 11);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "hello world", 11);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 11);
		} else if (strcmp(archive_entry_pathname(ae), "cb/fe") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 0);
		}
	}
	/* There is no entry. */
	failure("There should be no entry");
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Destroy the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	assertEqualInt(ARCHIVE_OK, archive_match_free(m));
	archive_entry_free(ae);
}